

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles2::Functional::(anonymous_namespace)::ConstantShaderGenerator::next_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ShaderType shaderType)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  char *pcVar5;
  float fVar6;
  string valueString;
  string outputName;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long local_1d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [3];
  ios_base local_130 [264];
  
  fVar6 = deRandom_getFloat((deRandom *)((long)this + 8));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::ostream::_M_insert<double>((double)(fVar6 + 0.0));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  pcVar5 = "gl_FragColor";
  if (shaderType == SHADERTYPE_VERTEX) {
    pcVar5 = "gl_Position";
  }
  local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,pcVar5,pcVar5 + (0xc - (ulong)(shaderType == SHADERTYPE_VERTEX)));
  std::operator+(&local_1c0,"#version 100\nvoid main (void) { ",local_1a0);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_210 = *plVar3;
    lStack_208 = plVar2[3];
    local_220 = &local_210;
  }
  else {
    local_210 = *plVar3;
    local_220 = (long *)*plVar2;
  }
  local_218 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_1e0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_1f0 = *plVar3;
    lStack_1e8 = plVar2[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *plVar3;
    local_200 = (long *)*plVar2;
  }
  local_1f8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_200);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantShaderGenerator::next (const glu::ShaderType shaderType)
{
	DE_ASSERT(shaderType == glu::SHADERTYPE_VERTEX || shaderType == glu::SHADERTYPE_FRAGMENT);

	const float			value		= m_rnd.getFloat(0.0f, 1.0f);
	const std::string	valueString	= de::toString(value);
	const std::string	outputName	= (shaderType == glu::SHADERTYPE_VERTEX) ? "gl_Position" : "gl_FragColor";

	std::string source =
		"#version 100\n"
		"void main (void) { " + outputName + " = vec4(" + valueString + "); }\n";

	return source;
}